

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlUInteger.cpp
# Opt level: O2

filepos_t __thiscall
libebml::EbmlUInteger::RenderData(EbmlUInteger *this,IOCallback *output,bool param_2,bool param_3)

{
  int iVar1;
  ulong uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint64 uVar3;
  binary FinalData [8];
  undefined8 uStack_28;
  
  uVar2 = 0;
  if ((this->super_EbmlElement).SizeLength < 9) {
    uStack_28 = 0;
    uVar3 = this->Value;
    while( true ) {
      iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
      if (CONCAT44(extraout_var,iVar1) <= uVar2) break;
      iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
      *(char *)((long)&uStack_28 + ~uVar2 + CONCAT44(extraout_var_00,iVar1)) = (char)uVar3;
      uVar3 = uVar3 >> 8;
      uVar2 = (ulong)((int)uVar2 + 1);
    }
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    IOCallback::writeFully(output,&uStack_28,CONCAT44(extraout_var_01,iVar1));
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    uVar2 = CONCAT44(extraout_var_02,iVar1);
  }
  return uVar2;
}

Assistant:

filepos_t EbmlUInteger::RenderData(IOCallback & output, bool /* bForceRender */, bool /* bWithDefault */)
{
  binary FinalData[8]; // we don't handle more than 64 bits integers

  if (GetSizeLength() > 8)
    return 0; // integer bigger coded on more than 64 bits are not supported

  uint64 TempValue = Value;
  for (unsigned int i=0; i<GetSize();i++) {
    FinalData[GetSize()-i-1] = TempValue & 0xFF;
    TempValue >>= 8;
  }

  output.writeFully(FinalData,GetSize());

  return GetSize();
}